

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

void __thiscall AActor::CheckSectorTransition(AActor *this,sector_t *oldsec)

{
  double dVar1;
  double dVar2;
  ASectorAction *pAVar3;
  sector_t *psVar4;
  sector_t *psVar5;
  uint activationType;
  double dVar6;
  
  if (this->Sector != oldsec) {
    pAVar3 = (oldsec->SecActTarget).field_0.p;
    if (pAVar3 != (ASectorAction *)0x0) {
      if (((pAVar3->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        ASectorAction::TriggerAction((oldsec->SecActTarget).field_0.p,this,2);
      }
      else {
        (oldsec->SecActTarget).field_0.p = (ASectorAction *)0x0;
      }
    }
    pAVar3 = (this->Sector->SecActTarget).field_0.p;
    if (pAVar3 != (ASectorAction *)0x0) {
      if (((pAVar3->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        psVar4 = this->Sector;
        dVar6 = (this->__Pos).X;
        dVar1 = (this->__Pos).Y;
        dVar2 = (this->__Pos).Z;
        activationType =
             (uint)(dVar2 <= ((psVar4->floorplane).normal.Y * dVar1 +
                             (psVar4->floorplane).normal.X * dVar6 + (psVar4->floorplane).D) *
                             (psVar4->floorplane).negiC) * 4 +
             (uint)(((psVar4->ceilingplane).normal.Y * dVar1 +
                    (psVar4->ceilingplane).normal.X * dVar6 + (psVar4->ceilingplane).D) *
                    (psVar4->ceilingplane).negiC <= this->Height + dVar2) * 8 + 1;
        psVar5 = psVar4->heightsec;
        if (((psVar5 != (sector_t *)0x0) &&
            (dVar6 = (dVar1 * (psVar5->floorplane).normal.Y +
                     dVar6 * (psVar5->floorplane).normal.X + (psVar5->floorplane).D) *
                     (psVar5->floorplane).negiC, dVar2 == dVar6)) && (!NAN(dVar2) && !NAN(dVar6))) {
          activationType = activationType | 0x400;
        }
        ASectorAction::TriggerAction((psVar4->SecActTarget).field_0.p,this,activationType);
      }
      else {
        (this->Sector->SecActTarget).field_0.p = (ASectorAction *)0x0;
      }
    }
    dVar6 = (this->__Pos).Z;
    if ((dVar6 == this->floorz) && (!NAN(dVar6) && !NAN(this->floorz))) {
      P_CheckFor3DFloorHit(this,dVar6);
    }
    dVar6 = (this->__Pos).Z + this->Height;
    if ((dVar6 == this->ceilingz) && (!NAN(dVar6) && !NAN(this->ceilingz))) {
      P_CheckFor3DCeilingHit(this,dVar6);
      return;
    }
  }
  return;
}

Assistant:

void AActor::CheckSectorTransition(sector_t *oldsec)
{
	if (oldsec != Sector)
	{
		if (oldsec->SecActTarget != NULL)
		{
			oldsec->SecActTarget->TriggerAction(this, SECSPAC_Exit);
		}
		if (Sector->SecActTarget != NULL)
		{
			int act = SECSPAC_Enter;
			if (Z() <= Sector->floorplane.ZatPoint(this))
			{
				act |= SECSPAC_HitFloor;
			}
			if (Top() >= Sector->ceilingplane.ZatPoint(this))
			{
				act |= SECSPAC_HitCeiling;
			}
			if (Sector->heightsec != NULL && Z() == Sector->heightsec->floorplane.ZatPoint(this))
			{
				act |= SECSPAC_HitFakeFloor;
			}
			Sector->SecActTarget->TriggerAction(this, act);
		}
		if (Z() == floorz)
		{
			P_CheckFor3DFloorHit(this, Z());
		}
		if (Top() == ceilingz)
		{
			P_CheckFor3DCeilingHit(this, Top());
		}
	}
}